

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deString.c
# Opt level: O0

size_t deStrnlen(char *string,size_t maxSize)

{
  bool bVar1;
  ulong local_20;
  size_t len;
  size_t maxSize_local;
  char *string_local;
  
  local_20 = 0;
  while( true ) {
    bVar1 = false;
    if (local_20 < maxSize) {
      bVar1 = string[local_20] != '\0';
    }
    if (!bVar1) break;
    local_20 = local_20 + 1;
  }
  return local_20;
}

Assistant:

size_t deStrnlen (const char* string, size_t maxSize)
{
#if ((DE_COMPILER == DE_COMPILER_MSC) && (DE_OS != DE_OS_WINCE))
	return strnlen_s(string, maxSize);
#else
	size_t len = 0;
	while (len < maxSize && string[len] != 0)
		++len;
	return len;
#endif
}